

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall NPC::~NPC(NPC *this)

{
  Map *pMVar1;
  _List_node_base *p_Var2;
  long lVar3;
  NPC *in_RAX;
  _List_iterator<NPC_*> __first;
  _List_node_base *p_Var4;
  _List_iterator<NPC_*> __last;
  NPC *local_38;
  
  pMVar1 = this->map;
  for (p_Var4 = (pMVar1->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&pMVar1->characters; p_Var4 = p_Var4->_M_next) {
    p_Var2 = p_Var4[1]._M_next;
    if ((NPC *)p_Var2[0x1d]._M_next == this) {
      p_Var2[0x1d]._M_next = (_List_node_base *)0x0;
      *(undefined4 *)((long)(p_Var2 + 0x1d) + 8) = 0;
    }
  }
  local_38 = in_RAX;
  for (p_Var4 = (this->damagelist).
                super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&this->damagelist; p_Var4 = p_Var4->_M_next) {
    lVar3 = (long)(p_Var4[1]._M_next)->_M_next;
    __last._M_node = (_List_node_base *)(lVar3 + 0x378);
    local_38 = this;
    __first = std::
              __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                        (*(_List_node_base **)(lVar3 + 0x378),__last,
                         (_Iter_equals_val<NPC_*const>)&local_38);
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
              ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,(const_iterator)__first._M_node
               ,(p_Var4[1]._M_next)->_M_next + 0x378);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::_M_clear(&(this->damagelist).
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            );
  return;
}

Assistant:

NPC::~NPC()
{
	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->npc == this)
		{
			character->npc = 0;
			character->npc_type = ENF::NPC;
		}
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}
}